

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

MemOp gen_pop_T0(DisasContext *s)

{
  MemOp idx;
  MemOp aflag;
  
  idx = s->dflag;
  if (s->code64 == 0) {
    aflag = MO_32 - (s->ss32 == 0);
  }
  else {
    idx = (uint)(idx != MO_16) * 2 + MO_16;
    aflag = MO_64;
  }
  gen_lea_v_seg(s,aflag,s->uc->tcg_ctx->cpu_regs[4],2,-1);
  gen_op_ld_v(s,idx,s->T0,s->A0);
  return idx;
}

Assistant:

static MemOp gen_pop_T0(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    MemOp d_ot = mo_pushpop(s, s->dflag);

    gen_lea_v_seg(s, mo_stacksize(s), tcg_ctx->cpu_regs[R_ESP], R_SS, -1);
    gen_op_ld_v(s, d_ot, s->T0, s->A0);

    return d_ot;
}